

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O3

void __thiscall
TCLAP::ArgException::ArgException(ArgException *this,string *text,string *id,string *td)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__ArgException_001289e8;
  (this->_errorText)._M_dataplus._M_p = (pointer)&(this->_errorText).field_2;
  pcVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_errorText,pcVar1,pcVar1 + text->_M_string_length);
  (this->_argId)._M_dataplus._M_p = (pointer)&(this->_argId).field_2;
  pcVar1 = (id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_argId,pcVar1,pcVar1 + id->_M_string_length);
  (this->_typeDescription)._M_dataplus._M_p = (pointer)&(this->_typeDescription).field_2;
  pcVar1 = (td->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_typeDescription,pcVar1,pcVar1 + td->_M_string_length);
  return;
}

Assistant:

ArgException( const std::string& text = "undefined exception", 
					  const std::string& id = "undefined",
					  const std::string& td = "Generic ArgException")
			: std::exception(), 
			  _errorText(text), 
			  _argId( id ), 
			  _typeDescription(td)
		{ }